

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_macros.cpp
# Opt level: O3

bool __thiscall
slang::parsing::Preprocessor::applyMacroOps
          (Preprocessor *this,span<const_slang::parsing::Token,_18446744073709551615UL> tokens,
          SmallVectorBase<slang::parsing::Token> *dest)

{
  ulong uVar1;
  pointer pTVar2;
  pointer pTVar3;
  LanguageVersion LVar4;
  undefined2 uVar5;
  undefined2 uVar6;
  undefined1 uVar9;
  undefined1 uVar11;
  undefined4 uVar13;
  BumpAllocator *pBVar7;
  _Tuple_impl<0UL,_slang::parsing::Lexer_*,_std::default_delete<slang::parsing::Lexer>_> parentLexer
  ;
  undefined1 uVar10;
  undefined1 uVar12;
  undefined4 uVar14;
  size_type sVar8;
  undefined2 uVar15;
  undefined1 uVar16;
  undefined1 uVar18;
  undefined4 uVar20;
  undefined8 uVar21;
  Info *pIVar22;
  Token endToken;
  Token endToken_00;
  string_view rawText;
  Token endToken_01;
  Token TVar23;
  span<slang::parsing::Token,_18446744073709551615UL> bodyTokens;
  span<slang::parsing::Token,_18446744073709551615UL> bodyTokens_00;
  span<slang::parsing::Token,_18446744073709551615UL> bodyTokens_01;
  undefined8 uVar24;
  bool bVar25;
  int iVar26;
  SyntaxKind SVar27;
  pointer pTVar28;
  Diagnostic *this_00;
  undefined4 extraout_var;
  size_type sVar29;
  SourceLocation SVar30;
  __extent_storage<18446744073709551615UL> _Var31;
  char *pcVar32;
  EVP_PKEY_CTX *src;
  __extent_storage<18446744073709551615UL> extraout_RDX;
  size_type sVar33;
  size_t sVar34;
  __extent_storage<18446744073709551615UL> in_R8;
  Token *this_01;
  ulong uVar35;
  bool bVar36;
  bool bVar37;
  undefined4 uVar38;
  span<slang::parsing::Token,_18446744073709551615UL> tokens_00;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar39;
  Trivia TVar40;
  Token startToken;
  Token startToken_00;
  string_view arg;
  Token startToken_01;
  Token left_00;
  string_view rawText_00;
  Token left_01;
  Token sourceToken;
  Token stringify;
  Token token;
  string_view raw;
  Token syntheticComment;
  Token extraToAppend;
  Token left;
  SmallVector<slang::parsing::Token,_8UL> stringifyBuffer;
  SmallVector<slang::parsing::Token,_8UL> commentBuffer;
  SmallVector<slang::parsing::Trivia,_8UL> emptyArgTrivia;
  uint32_t uVar41;
  SmallVectorBase<slang::parsing::Token> *in_stack_fffffffffffffc58;
  Token local_388;
  SmallVectorBase<slang::parsing::Token> *local_370;
  Token local_368;
  undefined8 local_350;
  Token local_348;
  Token local_338;
  Token local_328;
  pointer local_310;
  Token local_308;
  undefined6 uStack_2f8;
  undefined2 local_2f2;
  undefined6 uStack_2f0;
  Token local_2e8;
  undefined8 local_2d8;
  Token local_2d0 [8];
  size_type local_248;
  Info *local_240;
  ulong local_238;
  size_t local_230;
  undefined8 local_228;
  char *pcStack_220;
  undefined8 local_218;
  char *pcStack_210;
  Token local_208;
  SmallVectorBase<slang::parsing::Token> local_1f8 [3];
  undefined1 local_160 [152];
  SmallVectorBase<slang::parsing::Trivia> local_c8 [3];
  undefined6 uVar17;
  undefined5 uVar19;
  
  _Var31 = tokens._M_extent._M_extent_value;
  local_c8[0].data_ = (pointer)local_c8[0].firstElement;
  local_c8[0].len = 0;
  local_c8[0].cap = 8;
  local_1f8[0].data_ = (pointer)local_1f8[0].firstElement;
  local_1f8[0].len = 0;
  local_1f8[0].cap = 8;
  local_160._0_8_ = local_160 + 0x18;
  local_160._8_8_ = (pointer)0x0;
  local_160._16_8_ = 8;
  local_370 = dest;
  Token::Token(&local_368);
  Token::Token(&local_328);
  Token::Token(&local_308);
  if (_Var31._M_extent_value == 0) {
    local_350 = 0;
  }
  else {
    local_238 = _Var31._M_extent_value - 1;
    local_350 = 0;
    bVar37 = false;
    uVar35 = 0;
    local_310 = tokens._M_ptr;
    local_230 = _Var31._M_extent_value;
    do {
      Token::Token(&local_388);
      pTVar28 = local_310 + uVar35;
      uVar15 = pTVar28->kind;
      uVar16 = pTVar28->field_0x2;
      uVar18 = pTVar28->numFlags;
      uVar20 = pTVar28->rawLen;
      uVar19 = CONCAT41(uVar20,uVar18);
      uVar17 = CONCAT51(uVar19,uVar16);
      local_348._2_2_ = SUB62(uVar17,0);
      local_348.info._0_4_ = SUB84(pTVar28->info,0);
      local_348.info._4_4_ = (undefined4)((ulong)pTVar28->info >> 0x20);
      local_348.kind = uVar15;
      local_348.rawLen = uVar20;
      if ((ushort)uVar15 - 0x15a < 2) {
        pTVar28 = local_310 + uVar35;
        if (local_368.info == (Info *)0x0) {
          local_368.kind = pTVar28->kind;
          local_368._2_1_ = pTVar28->field_0x2;
          local_368.numFlags.raw = (pTVar28->numFlags).raw;
          local_368.rawLen = pTVar28->rawLen;
          local_368.info = pTVar28->info;
          local_1f8[0].len = 0;
          bVar37 = false;
          if ((uVar15 == MacroTripleQuote) && ((int)(this->options).languageVersion < 1)) {
            SVar30 = Token::location(&local_348);
            this_00 = addDiag(this,(DiagCode)0x20001,SVar30);
            LVar4 = (this->options).languageVersion;
            sVar34 = 9;
            if (LVar4 == Default) {
              pcVar32 = "1800-2017";
            }
            else if (LVar4 == v1800_2023) {
              pcVar32 = "1800-2023";
            }
            else {
              pcVar32 = "";
              sVar34 = 0;
            }
            arg._M_str = pcVar32;
            arg._M_len = sVar34;
            Diagnostic::operator<<(this_00,arg);
            goto LAB_00203f42;
          }
        }
        else {
          if (uVar15 == local_368.kind) {
            bodyTokens._M_extent._M_extent_value = local_1f8[0].len;
            bodyTokens._M_ptr = local_1f8[0].data_;
            endToken.info._1_7_ = (int7)((ulong)pTVar28->info >> 8);
            endToken._0_9_ = *(unkbyte9 *)pTVar28;
            startToken.info = local_368.info;
            startToken.kind = local_368.kind;
            startToken._2_1_ = local_368._2_1_;
            startToken.numFlags.raw = local_368.numFlags.raw;
            startToken.rawLen = local_368.rawLen;
            in_R8._M_extent_value = local_1f8[0].len;
            local_388 = Lexer::stringify((Lexer *)(this->lexerStack).
                                                  super_SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
                                                  .data_[(this->lexerStack).
                                                                                                                  
                                                  super_SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
                                                  .len - 1]._M_t.
                                                  super___uniq_ptr_impl<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_slang::parsing::Lexer_*,_std::default_delete<slang::parsing::Lexer>_>
                                                  .
                                                  super__Head_base<0UL,_slang::parsing::Lexer_*,_false>
                                         ,startToken,bodyTokens,endToken);
            Token::Token(&local_2e8);
            TVar23 = local_2e8;
            local_368.kind = local_2e8.kind;
            local_368._2_1_ = local_2e8._2_1_;
            local_368.numFlags.raw = local_2e8.numFlags.raw;
            local_368.rawLen = local_2e8.rawLen;
            local_368.info = local_2e8.info;
            local_2e8 = TVar23;
          }
          else {
            if (local_368.kind == MacroTripleQuote) {
              uVar38._0_2_ = pTVar28->kind;
              uVar38._2_1_ = pTVar28->field_0x2;
              uVar38._3_1_ = pTVar28->numFlags;
              local_388.rawLen = pTVar28->rawLen;
              local_388.info._0_4_ = *(undefined4 *)&pTVar28->info;
              local_388.info._4_4_ = *(undefined4 *)((long)&pTVar28->info + 4);
              goto LAB_00203e0a;
            }
            bodyTokens_00._M_extent._M_extent_value = local_1f8[0].len;
            bodyTokens_00._M_ptr = local_1f8[0].data_;
            endToken_00.info._1_7_ = (int7)((ulong)pTVar28->info >> 8);
            endToken_00._0_9_ = *(unkbyte9 *)pTVar28;
            startToken_00.info = local_368.info;
            startToken_00.kind = local_368.kind;
            startToken_00._2_1_ = local_368._2_1_;
            startToken_00.numFlags.raw = local_368.numFlags.raw;
            startToken_00.rawLen = local_368.rawLen;
            local_388 = Lexer::stringify((Lexer *)(this->lexerStack).
                                                  super_SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
                                                  .data_[(this->lexerStack).
                                                                                                                  
                                                  super_SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
                                                  .len - 1]._M_t.
                                                  super___uniq_ptr_impl<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_slang::parsing::Lexer_*,_std::default_delete<slang::parsing::Lexer>_>
                                                  .
                                                  super__Head_base<0UL,_slang::parsing::Lexer_*,_false>
                                         ,startToken_00,bodyTokens_00,endToken_00);
            Token::Token(&local_2e8);
            TVar23 = local_2e8;
            local_368.kind = local_2e8.kind;
            local_368._2_1_ = local_2e8._2_1_;
            local_368.numFlags.raw = local_2e8.numFlags.raw;
            local_368.rawLen = local_2e8.rawLen;
            local_368.info = local_2e8.info;
            pBVar7 = this->alloc;
            local_218 = 2;
            pcStack_210 = "\"\"";
            local_2e8 = TVar23;
            SVar30 = Token::location(&local_348);
            local_228 = 0;
            pcStack_220 = "";
            in_stack_fffffffffffffc58 = (SmallVectorBase<slang::parsing::Token> *)0x0;
            in_R8._M_extent_value = 0;
            rawText._M_str._0_1_ = (char)pcStack_210;
            rawText._M_len = local_218;
            rawText._M_str._1_7_ = (int7)((ulong)pcStack_210 >> 8);
            Token::Token(&local_2e8,pBVar7,StringLiteral,
                         (span<const_slang::parsing::Trivia,_18446744073709551615UL>)ZEXT816(0),
                         rawText,(SourceLocation)
                                 ((long)SVar30 * 0x10 + 0x200000000 >> 4 & 0xfffffffff0000000U |
                                 (ulong)(SVar30._0_4_ & 0xfffffff)),
                         (string_view)(ZEXT816(0x47e5a6) << 0x40));
            TVar23 = local_2e8;
            local_308.kind = local_2e8.kind;
            local_308._2_1_ = local_2e8._2_1_;
            local_308.numFlags.raw = local_2e8.numFlags.raw;
            local_308.rawLen = local_2e8.rawLen;
            local_308.info = local_2e8.info;
            local_2e8 = TVar23;
          }
LAB_00203f42:
          bVar37 = false;
        }
LAB_00203f44:
        if (local_388.info != (Info *)0x0) {
          if (local_388.kind == EmptyMacroArgument) {
            sVar39 = Token::trivia(&local_388);
            SmallVectorBase<slang::parsing::Trivia>::
            append<__gnu_cxx::__normal_iterator<const_slang::parsing::Trivia_*,_std::span<const_slang::parsing::Trivia,_18446744073709551615UL>_>_>
                      (local_c8,sVar39._M_ptr,
                       sVar39._M_ptr + sVar39._M_extent._M_extent_value._M_extent_value);
          }
          else {
            if (local_c8[0].len != 0) {
              sVar39 = Token::trivia(&local_388);
              SmallVectorBase<slang::parsing::Trivia>::
              append<__gnu_cxx::__normal_iterator<const_slang::parsing::Trivia_*,_std::span<const_slang::parsing::Trivia,_18446744073709551615UL>_>_>
                        (local_c8,sVar39._M_ptr,
                         sVar39._M_ptr + sVar39._M_extent._M_extent_value._M_extent_value);
              pBVar7 = this->alloc;
              iVar26 = SmallVectorBase<slang::parsing::Trivia>::copy
                                 (local_c8,(EVP_PKEY_CTX *)pBVar7,src);
              sVar39._M_ptr._4_4_ = extraout_var;
              sVar39._M_ptr._0_4_ = iVar26;
              sVar39._M_extent._M_extent_value = extraout_RDX._M_extent_value;
              local_388 = Token::withTrivia(&local_388,pBVar7,sVar39);
              local_c8[0].len = 0;
            }
            if (local_368.info == (Info *)0x0) {
              if (local_328.info == (Info *)0x0) {
                SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token_const&>
                          (local_370,&local_388);
                if (local_308.info != (Info *)0x0) {
                  SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token_const&>
                            (local_370,&local_308);
                  Token::Token(&local_2e8);
                  TVar23 = local_2e8;
                  local_308.kind = local_2e8.kind;
                  local_308._2_1_ = local_2e8._2_1_;
                  local_308.numFlags.raw = local_2e8.numFlags.raw;
                  local_308.rawLen = local_2e8.rawLen;
                  local_308.info = local_2e8.info;
                  local_2e8 = TVar23;
                }
              }
              else {
                SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token_const&>
                          ((SmallVectorBase<slang::parsing::Token> *)local_160,&local_388);
              }
            }
            else {
              local_338 = (Token)Token::rawText(&local_388);
              if (((local_338._0_8_ != 0 && local_388.kind == Identifier) &&
                  (*(char *)&(local_338.info)->rawTextPtr == '\\')) &&
                 (sVar29 = std::basic_string_view<char,_std::char_traits<char>_>::find
                                     ((basic_string_view<char,_std::char_traits<char>_> *)&local_338
                                      ,"`\"",0,2), sVar29 != 0xffffffffffffffff)) {
                if ((ulong)local_338._0_8_ < sVar29) {
                  std::__throw_out_of_range_fmt
                            ("%s: __pos (which is %zu) > __size (which is %zu)",
                             "basic_string_view::substr",sVar29);
                }
                bVar36 = local_368.kind != MacroTripleQuote;
                local_2e8.info = (Info *)((long)&(local_338.info)->rawTextPtr + sVar29);
                local_2e8._0_8_ = local_338._0_8_ - sVar29;
                bVar25 = std::basic_string_view<char,_std::char_traits<char>_>::starts_with
                                   ((basic_string_view<char,_std::char_traits<char>_> *)&local_2e8,
                                    "`\"\"\"");
                if (bVar36 || bVar25) {
                  sVar33 = local_338._0_8_;
                  if (sVar29 <= (ulong)local_338._0_8_) {
                    sVar33 = sVar29;
                  }
                  rawText_00._M_str = (char *)local_338.info;
                  rawText_00._M_len = sVar33;
                  local_248 = sVar29;
                  local_2e8 = Token::withRawText(&local_388,this->alloc,rawText_00);
                  SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token>
                            (local_1f8,&local_2e8);
                  uVar21 = local_368._0_8_;
                  parentLexer.super__Head_base<0UL,_slang::parsing::Lexer_*,_false>._M_head_impl =
                       (this->lexerStack).
                       super_SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
                       .data_[(this->lexerStack).
                              super_SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
                              .len - 1]._M_t.
                       super___uniq_ptr_impl<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_slang::parsing::Lexer_*,_std::default_delete<slang::parsing::Lexer>_>
                       .super__Head_base<0UL,_slang::parsing::Lexer_*,_false>;
                  local_240 = local_368.info;
                  bodyTokens_01._M_extent._M_extent_value = local_1f8[0].len;
                  bodyTokens_01._M_ptr = local_1f8[0].data_;
                  Token::Token(&local_208);
                  uVar24 = local_368._0_8_;
                  uVar41 = local_208.rawLen;
                  endToken_01.info._0_1_ = (char)local_208.info;
                  endToken_01.kind = local_208.kind;
                  endToken_01._2_1_ = local_208._2_1_;
                  endToken_01.numFlags.raw = local_208.numFlags.raw;
                  endToken_01.rawLen = local_208.rawLen;
                  endToken_01.info._1_7_ = (int7)((ulong)local_208.info >> 8);
                  startToken_01.info = local_240;
                  local_368.kind = (TokenKind)uVar21;
                  local_368._2_1_ = SUB81(uVar21,2);
                  local_368.numFlags.raw = SUB81(uVar21,3);
                  local_368.rawLen = SUB84(uVar21,4);
                  startToken_01.kind = local_368.kind;
                  startToken_01._2_1_ = local_368._2_1_;
                  startToken_01.numFlags.raw = local_368.numFlags.raw;
                  startToken_01.rawLen = local_368.rawLen;
                  local_368._0_8_ = uVar24;
                  local_2e8 = Lexer::stringify((Lexer *)parentLexer.
                                                                                                                
                                                  super__Head_base<0UL,_slang::parsing::Lexer_*,_false>
                                                  ._M_head_impl,startToken_01,bodyTokens_01,
                                               endToken_01);
                  SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token>
                            (local_370,&local_2e8);
                  Token::Token(&local_2e8);
                  local_368.kind = local_2e8.kind;
                  local_368._2_1_ = local_2e8._2_1_;
                  local_368.numFlags.raw = local_2e8.numFlags.raw;
                  local_368.rawLen = local_2e8.rawLen;
                  local_368.info = local_2e8.info;
                  local_2e8.info = (Info *)0x0;
                  local_2e8._0_8_ = local_2d0;
                  local_2d8 = 8;
                  sourceToken.info = (Info *)(local_248 + 2 + (ulong)bVar25 * 2);
                  sourceToken._0_8_ = local_388.info;
                  in_R8._M_extent_value = (size_t)local_388.info;
                  Lexer::splitTokens((Lexer *)this->alloc,(BumpAllocator *)this->diagnostics,
                                     (Diagnostics *)this->sourceManager,
                                     (SourceManager *)local_388._0_8_,sourceToken,
                                     CONCAT44(uVar41,(uint)(this->keywordVersionStack).
                                                                                                                      
                                                  super__Vector_base<slang::parsing::KeywordVersion,_std::allocator<slang::parsing::KeywordVersion>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish[-1]),
                                     (KeywordVersion)&local_2e8,in_stack_fffffffffffffc58);
                  bVar25 = applyMacroOps(this,(span<const_slang::parsing::Token,_18446744073709551615UL>
                                               )local_2e8,local_370);
                  if ((Token *)local_2e8._0_8_ != local_2d0) {
                    operator_delete((void *)local_2e8._0_8_);
                  }
                  local_350 = CONCAT71((int7)((ulong)local_350 >> 8),(byte)local_350 | bVar25);
                  goto LAB_002042fc;
                }
              }
              SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token_const&>
                        (local_1f8,&local_388);
            }
          }
        }
      }
      else {
        if (uVar15 != MacroPaste) {
          if ((bVar37) &&
             (sVar39 = Token::trivia(&local_348),
             sVar39._M_extent._M_extent_value._M_extent_value == 0 && local_c8[0].len == 0)) {
            pTVar2 = local_370->data_ + (local_370->len - 1);
            uVar5 = pTVar2->kind;
            uVar9 = pTVar2->field_0x2;
            uVar11 = pTVar2->numFlags;
            uVar13 = pTVar2->rawLen;
            left_00.rawLen = uVar13;
            left_00.numFlags.raw = uVar11;
            left_00._2_1_ = uVar9;
            left_00.kind = uVar5;
            in_R8._M_extent_value =
                 CONCAT44(local_348.rawLen,CONCAT22(local_348._2_2_,local_348.kind));
            TVar23._2_1_ = local_348._2_1_;
            TVar23.numFlags.raw = local_348.numFlags.raw;
            TVar23.kind = local_348.kind;
            TVar23.rawLen = local_348.rawLen;
            TVar23.info._0_4_ = local_348.info._0_4_;
            TVar23.info._4_4_ = local_348.info._4_4_;
            left_00.info = local_370->data_[local_370->len - 1].info;
            local_388 = Lexer::concatenateTokens(this->alloc,this->sourceManager,left_00,TVar23);
            if (local_388.info != (Info *)0x0) {
              local_370->len = local_370->len - 1;
              bVar37 = true;
              goto LAB_00203f44;
            }
          }
          uVar38 = CONCAT22(local_348._2_2_,local_348.kind);
          local_388.rawLen = local_348.rawLen;
          local_388.info._0_4_ = local_348.info._0_4_;
          local_388.info._4_4_ = local_348.info._4_4_;
LAB_00203e0a:
          local_388.kind = (short)uVar38;
          local_388._2_1_ = (char)((uint)uVar38 >> 0x10);
          local_388.numFlags.raw = (char)((uint)uVar38 >> 0x18);
          goto LAB_00203f42;
        }
        if ((uVar35 == local_238 || uVar35 == 0) ||
           (sVar39 = Token::trivia(&local_348),
           sVar39._M_extent._M_extent_value._M_extent_value != 0)) {
LAB_00203d39:
          SVar30 = Token::location(&local_348);
          addDiag(this,(DiagCode)0x230004,SVar30);
          sVar39 = Token::trivia(&local_348);
          SmallVectorBase<slang::parsing::Trivia>::
          append<__gnu_cxx::__normal_iterator<const_slang::parsing::Trivia_*,_std::span<const_slang::parsing::Trivia,_18446744073709551615UL>_>_>
                    (local_c8,sVar39._M_ptr,
                     sVar39._M_ptr + sVar39._M_extent._M_extent_value._M_extent_value);
          goto LAB_00203f42;
        }
        uVar1 = uVar35 + 1;
        this_01 = local_310 + uVar1;
        sVar39 = Token::trivia(this_01);
        if (sVar39._M_extent._M_extent_value._M_extent_value != 0 || local_c8[0].len != 0)
        goto LAB_00203d39;
        if (local_368.info == (Info *)0x0) {
          if (local_328.info == (Info *)0x0) {
            sVar8 = local_370->len;
            pTVar2 = local_370->data_ + (sVar8 - 1);
            uVar21._0_2_ = pTVar2->kind;
            uVar21._2_1_ = pTVar2->field_0x2;
            uVar21._3_1_ = (pTVar2->numFlags).raw;
            uVar21._4_4_ = pTVar2->rawLen;
            pIVar22 = pTVar2->info;
            local_2e8 = *pTVar2;
            uStack_2f0 = (undefined6)((ulong)this_01->info >> 0x10);
            uStack_2f8 = (undefined6)*(undefined8 *)&this_01->field_0x2;
            local_2f2 = (undefined2)((ulong)*(undefined8 *)&this_01->field_0x2 >> 0x30);
            if (((TokenKind)uVar21 != Slash) || (this_01->kind != Star)) {
              in_R8._M_extent_value = *(size_t *)this_01;
              local_388 = Lexer::concatenateTokens
                                    (this->alloc,this->sourceManager,local_370->data_[sVar8 - 1],
                                     *this_01);
              if (local_388.info == (Info *)0x0) {
                bVar37 = false;
              }
              else {
                local_370->len = local_370->len - 1;
                if (local_388.kind == Directive) {
                  SVar27 = Token::directiveKind(&local_388);
                  bVar37 = SVar27 == MacroUsage;
                }
                else {
                  bVar37 = false;
                }
                local_350 = CONCAT71((int7)((ulong)local_350 >> 8),(byte)local_350 | bVar37);
                bVar37 = true;
                uVar35 = uVar1;
              }
              goto LAB_00203f44;
            }
            local_160._8_8_ = (pointer)0x0;
            local_370->len = sVar8 - 1;
            local_328._0_8_ = uVar21;
            local_328.info = pIVar22;
            local_338 = Token::withTrivia(&local_2e8,this->alloc,
                                          (span<const_slang::parsing::Trivia,_18446744073709551615UL>
                                           )ZEXT816(0));
            SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token>
                      ((SmallVectorBase<slang::parsing::Token> *)local_160,&local_338);
            local_388.info._0_2_ = local_2f2;
            local_388._2_6_ = uStack_2f8;
            local_388.kind = Star;
            local_388.info._2_6_ = uStack_2f0;
          }
          else {
            if ((*(short *)(local_160._0_8_ + local_160._8_8_ * 0x10 + -0x10) != 0x1b) ||
               (this_01->kind != Slash)) goto LAB_00203f42;
            SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token_const&>
                      ((SmallVectorBase<slang::parsing::Token> *)local_160,this_01);
            sVar39 = Token::trivia(&local_328);
            SmallVectorBase<slang::parsing::Trivia>::
            append<__gnu_cxx::__normal_iterator<const_slang::parsing::Trivia_*,_std::span<const_slang::parsing::Trivia,_18446744073709551615UL>_>_>
                      (local_c8,sVar39._M_ptr,
                       sVar39._M_ptr + sVar39._M_extent._M_extent_value._M_extent_value);
            tokens_00._M_extent._M_extent_value = in_R8._M_extent_value;
            tokens_00._M_ptr = (pointer)local_160._8_8_;
            TVar40 = Lexer::commentify((Lexer *)this->alloc,(BumpAllocator *)this->sourceManager,
                                       (SourceManager *)local_160._0_8_,tokens_00);
            local_2e8._0_14_ = TVar40._0_14_;
            SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                      (local_c8,(Trivia *)&local_2e8);
            Token::Token(&local_2e8);
            TVar23 = local_2e8;
            local_328.kind = local_2e8.kind;
            local_328._2_1_ = local_2e8._2_1_;
            local_328.numFlags.raw = local_2e8.numFlags.raw;
            local_328.rawLen = local_2e8.rawLen;
            local_328.info = local_2e8.info;
            local_2e8 = TVar23;
          }
LAB_0020451c:
          bVar37 = false;
          uVar35 = uVar1;
          goto LAB_00203f44;
        }
        if ((local_1f8[0].len == 0) || ((this_01->kind & ~EndOfFile) == MacroQuote)) {
          SVar30 = Token::location(&local_348);
          addDiag(this,(DiagCode)0x230004,SVar30);
          goto LAB_00203f42;
        }
        pTVar3 = local_1f8[0].data_ + (local_1f8[0].len - 1);
        uVar6 = pTVar3->kind;
        uVar10 = pTVar3->field_0x2;
        uVar12 = pTVar3->numFlags;
        uVar14 = pTVar3->rawLen;
        left_01.rawLen = uVar14;
        left_01.numFlags.raw = uVar12;
        left_01._2_1_ = uVar10;
        left_01.kind = uVar6;
        in_R8._M_extent_value = *(size_t *)this_01;
        left_01.info = local_1f8[0].data_[local_1f8[0].len - 1].info;
        local_388 = Lexer::concatenateTokens(this->alloc,this->sourceManager,left_01,*this_01);
        if (local_388.info != (Info *)0x0) {
          local_1f8[0].len = local_1f8[0].len - 1;
          goto LAB_0020451c;
        }
        bVar37 = false;
      }
LAB_002042fc:
      uVar35 = uVar35 + 1;
    } while (uVar35 < local_230);
  }
  if (local_368.info != (Info *)0x0) {
    SVar30 = Token::location(&local_368);
    addDiag(this,(DiagCode)0x60004,SVar30);
  }
  if ((SourceManager *)local_160._0_8_ != (SourceManager *)(local_160 + 0x18)) {
    operator_delete((void *)local_160._0_8_);
  }
  if (local_1f8[0].data_ != (pointer)local_1f8[0].firstElement) {
    operator_delete(local_1f8[0].data_);
  }
  if (local_c8[0].data_ != (pointer)local_c8[0].firstElement) {
    operator_delete(local_c8[0].data_);
  }
  return (bool)((byte)local_350 & 1);
}

Assistant:

bool Preprocessor::applyMacroOps(std::span<Token const> tokens, SmallVectorBase<Token>& dest) {
    SmallVector<Trivia, 8> emptyArgTrivia;
    SmallVector<Token, 8> stringifyBuffer;
    SmallVector<Token, 8> commentBuffer;
    Token stringify;
    Token syntheticComment;
    Token extraToAppend;
    bool anyNewMacros = false;
    bool didConcat = false;

    for (size_t i = 0; i < tokens.size(); i++) {
        Token newToken;
        bool nextDidConcat = false;

        // Once we see a `" token, we start collecting tokens into their own
        // buffer for stringification. Otherwise, just add them to the final
        // expansion buffer.
        Token token = tokens[i];
        switch (token.kind) {
            case TokenKind::MacroQuote:
            case TokenKind::MacroTripleQuote:
                if (!stringify) {
                    stringify = token;
                    stringifyBuffer.clear();

                    if (token.kind == TokenKind::MacroTripleQuote &&
                        options.languageVersion < LanguageVersion::v1800_2023) {
                        addDiag(diag::WrongLanguageVersion, token.location())
                            << toString(options.languageVersion);
                    }
                }
                else if (token.kind == stringify.kind) {
                    // all done stringifying; convert saved tokens to string
                    newToken = Lexer::stringify(*lexerStack.back(), stringify, stringifyBuffer,
                                                token);
                    stringify = Token();
                }
                else if (stringify.kind == TokenKind::MacroTripleQuote) {
                    // We found a `" inside of a triple quoted stringification.
                    // Just keep it, let it become part of the string contents.
                    newToken = token;
                }
                else {
                    // We found a `""" inside of a single quoted stringification.
                    // The LRM doesn't say what to do, but I think it makes sense to
                    // split the token, end the previous stringification, and then
                    // append the essentially empty string literal after it.
                    // This will cause an error down the line since two string literals
                    // next to each other isn't ever valid.
                    newToken = Lexer::stringify(*lexerStack.back(), stringify, stringifyBuffer,
                                                token);
                    stringify = Token();
                    extraToAppend = Token(alloc, TokenKind::StringLiteral, {}, "\"\"",
                                          token.location() + 2, ""sv);
                }
                break;
            case TokenKind::MacroPaste:
                // Paste together previous token and next token; a macro paste on either end
                // of the buffer or one that borders whitespace should be ignored.
                // This isn't specified in the standard so I'm just guessing.
                if (i == 0 || i == tokens.size() - 1 || !token.trivia().empty() ||
                    !tokens[i + 1].trivia().empty() || !emptyArgTrivia.empty()) {

                    addDiag(diag::IgnoredMacroPaste, token.location());

                    // We're ignoring this token, but don't lose its trivia or our
                    // spacing can get messed up.
                    emptyArgTrivia.append_range(token.trivia());
                }
                else if (stringify) {
                    // If this is right after the opening quote or right before the closing quote,
                    // we're trying to concatenate something with nothing.
                    if (stringifyBuffer.empty() || tokens[i + 1].kind == TokenKind::MacroQuote ||
                        tokens[i + 1].kind == TokenKind::MacroTripleQuote) {
                        addDiag(diag::IgnoredMacroPaste, token.location());
                    }
                    else {
                        newToken = Lexer::concatenateTokens(alloc, sourceManager,
                                                            stringifyBuffer.back(), tokens[i + 1]);
                        if (newToken) {
                            stringifyBuffer.pop_back();
                            ++i;
                        }
                    }
                }
                else if (syntheticComment) {
                    // Check for a *``/ to end the synthetic comment. Otherwise ignore the paste,
                    // since this is just going to become a comment anyway.
                    if (commentBuffer.back().kind == TokenKind::Star &&
                        tokens[i + 1].kind == TokenKind::Slash) {
                        commentBuffer.push_back(tokens[i + 1]);
                        i++;

                        emptyArgTrivia.append_range(syntheticComment.trivia());
                        emptyArgTrivia.push_back(
                            Lexer::commentify(alloc, sourceManager, commentBuffer));
                        syntheticComment = Token();
                    }
                }
                else {
                    // Dest cannot be empty here, though it's not easy to see why at first glance.
                    Token left = dest.back();
                    Token right = tokens[i + 1];

                    // Other tools allow concatenating a '/' with a '*' to form a block comment.
                    // This seems like utter nonsense but real world code depends on it so
                    // we have to support it as well.
                    if (left.kind == TokenKind::Slash && right.kind == TokenKind::Star) {
                        commentBuffer.clear();
                        syntheticComment = left;
                        dest.pop_back();
                        ++i;

                        commentBuffer.push_back(left.withTrivia(alloc, {}));
                        newToken = right;
                    }
                    else {
                        newToken = Lexer::concatenateTokens(alloc, sourceManager, dest.back(),
                                                            tokens[i + 1]);
                        if (newToken) {
                            dest.pop_back();
                            ++i;

                            nextDidConcat = true;
                            anyNewMacros |= newToken.kind == TokenKind::Directive &&
                                            newToken.directiveKind() == SyntaxKind::MacroUsage;
                        }
                    }
                }
                break;
            default: {
                // If last iteration we did a token concatenation, check whether this token
                // is right next to it (not leading trivia). If so, we should try to
                // continue the concatenation process.
                if (didConcat && token.trivia().empty() && emptyArgTrivia.empty()) {
                    newToken = Lexer::concatenateTokens(alloc, sourceManager, dest.back(), token);
                    if (newToken) {
                        dest.pop_back();
                        nextDidConcat = true;
                        break;
                    }
                }

                // Otherwise take the token as it is.
                newToken = token;
                break;
            }
        }

        didConcat = nextDidConcat;
        if (!newToken)
            continue;

        // If we have an empty macro argument just collect its trivia and use it on the next token
        // we find. Note that this can be left over at the end of applying ops; that's fine,
        // nothing is relying on observing this after the end of the macro's tokens.
        if (newToken.kind == TokenKind::EmptyMacroArgument) {
            emptyArgTrivia.append_range(newToken.trivia());
            continue;
        }

        if (!emptyArgTrivia.empty()) {
            emptyArgTrivia.append_range(newToken.trivia());
            newToken = newToken.withTrivia(alloc, emptyArgTrivia.copy(alloc));
            emptyArgTrivia.clear();
        }

        if (!stringify) {
            if (syntheticComment) {
                commentBuffer.push_back(newToken);
            }
            else {
                dest.push_back(newToken);
                if (extraToAppend) {
                    dest.push_back(extraToAppend);
                    extraToAppend = Token();
                }
            }
            continue;
        }

        // If this is an escaped identifier that includes a `" within it, we need to split the
        // token up to match the behavior of other simulators.
        auto raw = newToken.rawText();
        if (newToken.kind == TokenKind::Identifier && !raw.empty() && raw[0] == '\\') {
            size_t offset = raw.find("`\"");
            if (offset != std::string_view::npos) {
                // Like above, we need to handle the case of mismatched delimiters.
                // If we match, we complete the stringification. If we found a `"
                // inside a triple quoted string, just keep going. If we found a `"""
                // inside a single quoted string, split and end.
                const bool startIsTriple = stringify.kind == TokenKind::MacroTripleQuote;
                const bool endIsTriple = raw.substr(offset).starts_with(R"(`""")");
                if (startIsTriple == endIsTriple || !startIsTriple) {
                    stringifyBuffer.push_back(newToken.withRawText(alloc, raw.substr(0, offset)));

                    // Note: endToken parameter here doesn't matter,
                    // we know there is no trivia to take.
                    dest.push_back(
                        Lexer::stringify(*lexerStack.back(), stringify, stringifyBuffer, Token()));
                    stringify = Token();

                    // Now we have the unfortunate task of re-lexing the remaining stuff after the
                    // split and then appending those tokens to the destination as well.
                    SmallVector<Token, 8> splits;
                    splitTokens(newToken, offset + (endIsTriple ? 4 : 2), splits);
                    anyNewMacros |= applyMacroOps(splits, dest);
                    continue;
                }
            }
        }

        stringifyBuffer.push_back(newToken);
    }

    if (stringify)
        addDiag(diag::ExpectedMacroStringifyEnd, stringify.location());

    return anyNewMacros;
}